

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

vector3f tinyusdz::transform(matrix4d *m,vector3f *p)

{
  vector3f vVar1;
  vector3f local_50;
  vector3f local_40;
  undefined1 local_34 [8];
  vector3f tx;
  vector3f *p_local;
  matrix4d *m_local;
  
  local_34._0_4_ = (undefined4)m->m[3][0];
  local_34._4_4_ = (undefined4)m->m[3][1];
  tx.x = (float)m->m[3][2];
  tx._4_8_ = p;
  vVar1 = value::MultV<tinyusdz::value::matrix4d,tinyusdz::value::vector3f,double,float,3ul>(m,p);
  local_50.z = vVar1.z;
  local_40.z = local_50.z;
  local_50._0_8_ = vVar1._0_8_;
  local_40.x = local_50.x;
  local_40.y = local_50.y;
  vVar1 = operator+(&local_40,(vector3f *)local_34);
  return vVar1;
}

Assistant:

value::vector3f transform(const value::matrix4d &m, const value::vector3f &p) {
  value::vector3f tx{float(m.m[3][0]), float(m.m[3][1]), float(m.m[3][2])};
  return value::MultV<value::matrix4d, value::vector3f, double, float, 3>(m, p) + tx;
}